

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

QSslConfiguration __thiscall QHttpNetworkReply::sslConfiguration(QHttpNetworkReply *this)

{
  bool bVar1;
  QSslSocket *pQVar2;
  QSharedDataPointer<QSslConfigurationPrivate> in_RDI;
  QSslSocket *sslSocket;
  QHttpNetworkReplyPrivate *d;
  QSharedDataPointer<QSslConfigurationPrivate> this_00;
  QSharedDataPointer<QSslConfigurationPrivate> this_01;
  
  this_00.d.ptr = in_RDI.d.ptr;
  this_01.d.ptr = in_RDI.d.ptr;
  d_func((QHttpNetworkReply *)0x306b39);
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QHttpNetworkConnectionChannel> *)0x306b4f);
  if (bVar1) {
    QPointer<QHttpNetworkConnectionChannel>::operator->
              ((QPointer<QHttpNetworkConnectionChannel> *)0x306b70);
    pQVar2 = qobject_cast<QSslSocket*>((QObject *)0x306b79);
    if (pQVar2 == (QSslSocket *)0x0) {
      QSslConfiguration::QSslConfiguration((QSslConfiguration *)this_00.d.ptr);
    }
    else {
      QSslSocket::sslConfiguration((QSslSocket *)this_01.d.ptr);
    }
  }
  else {
    QSslConfiguration::QSslConfiguration((QSslConfiguration *)this_00.d.ptr);
  }
  return (QSharedDataPointer<QSslConfigurationPrivate>)
         (QSharedDataPointer<QSslConfigurationPrivate>)in_RDI.d.ptr;
}

Assistant:

QSslConfiguration QHttpNetworkReply::sslConfiguration() const
{
    Q_D(const QHttpNetworkReply);

    if (!d->connectionChannel)
        return QSslConfiguration();

    QSslSocket *sslSocket = qobject_cast<QSslSocket*>(d->connectionChannel->socket);
    if (!sslSocket)
        return QSslConfiguration();

    return sslSocket->sslConfiguration();
}